

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float128_div_sparc(float128 a,float128 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int32_t zExp;
  ulong uVar7;
  ulong uVar8;
  uint64_t uVar9;
  long lVar10;
  ulong uVar11;
  ulong a0;
  bool bVar12;
  bool bVar13;
  float128 fVar14;
  int32_t bExp;
  uint64_t term2;
  int32_t aExp;
  float_status *local_78;
  uint64_t term1;
  uint64_t local_68;
  ulong local_60;
  ulong local_58;
  uint64_t term3;
  uint64_t term0;
  uint64_t local_40;
  ulong local_38;
  
  local_68 = b.low;
  uVar3 = a.low;
  uVar8 = a.high & 0xffffffffffff;
  uVar6 = a.high._6_2_ & 0x7fff;
  local_60 = b.high & 0xffffffffffff;
  bExp = b.high._6_2_ & 0x7fff;
  uVar7 = b.high ^ a.high;
  aExp = uVar6;
  local_40 = uVar3;
  local_38 = uVar8;
  if (uVar6 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        uVar3 == 0) {
      if (bExp != 0x7fff) goto LAB_008b17f7;
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_68 == 0) goto LAB_008b1815;
    }
LAB_008b15b2:
    fVar14 = propagateFloat128NaN(a,b,status);
    return fVar14;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_68 == 0) {
      if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
          uVar3 == 0) &&
          ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
LAB_008b1815:
        status->float_exception_flags = status->float_exception_flags | 1;
        fVar14.high = 0x7fffffffffffffff;
        fVar14.low = 0xffffffffffffffff;
        return fVar14;
      }
      status->float_exception_flags = status->float_exception_flags | 4;
LAB_008b17f7:
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar7 & 0x8000000000000000 | 0x7fff000000000000;
      return (float128)(auVar1 << 0x40);
    }
    normalizeFloat128Subnormal(local_60,local_68,&bExp,&local_60,&local_68);
LAB_008b15ee:
    local_78 = status;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          uVar3 == 0) goto LAB_008b182f;
      normalizeFloat128Subnormal(uVar8,uVar3,&aExp,&local_38,&local_40);
      uVar3 = local_40;
      uVar8 = local_38;
      uVar6 = aExp;
    }
    local_58 = uVar7 >> 0x3f;
    uVar11 = uVar3 << 0xf;
    uVar9 = uVar8 << 0xf | uVar3 >> 0x31 | 0x8000000000000000;
    uVar7 = local_68 * 0x8000;
    uVar8 = local_60 << 0xf | local_68 >> 0x31 | 0x8000000000000000;
    if ((uVar8 < uVar9) || (uVar7 <= uVar11 && uVar8 == uVar9)) {
      uVar9 = uVar9 >> 1;
      uVar11 = uVar11 >> 1 | (uVar3 >> 0x31) << 0x3f;
      zExp = (uVar6 - bExp) + 0x3ffe;
    }
    else {
      zExp = (uVar6 - bExp) + 0x3ffd;
    }
    uVar3 = estimateDiv128To64(uVar9,uVar11,uVar8);
    mul128By64To192(uVar8,uVar7,uVar3,&term0,&term1,&term2);
    uVar4 = -term2;
    a0 = (uVar11 - term1) - (ulong)(term2 != 0);
    for (lVar10 = ((uVar9 - term0) - (ulong)(uVar11 < term1)) -
                  (ulong)(uVar11 - term1 < (ulong)(term2 != 0)); lVar10 < 0;
        lVar10 = lVar10 + (ulong)(bVar13 || CARRY8(uVar11,(ulong)bVar12))) {
      uVar3 = uVar3 - 1;
      bVar12 = CARRY8(uVar4,uVar7);
      uVar4 = uVar4 + uVar7;
      bVar13 = CARRY8(a0,uVar8);
      uVar11 = a0 + uVar8;
      a0 = uVar11 + bVar12;
    }
    uVar9 = estimateDiv128To64(a0,uVar4,uVar8);
    if (((uint)uVar9 & 0x3fff) < 5) {
      mul128By64To192(uVar8,uVar7,uVar9,&term1,&term2,&term3);
      uVar5 = (uVar4 - term2) - (ulong)(term3 != 0);
      uVar11 = -term3;
      for (lVar10 = ((a0 - term1) - (ulong)(uVar4 < term2)) -
                    (ulong)(uVar4 - term2 < (ulong)(term3 != 0)); lVar10 < 0;
          lVar10 = lVar10 + (ulong)(bVar13 || CARRY8(uVar4,(ulong)bVar12))) {
        uVar9 = uVar9 - 1;
        bVar12 = CARRY8(uVar11,uVar7);
        uVar11 = uVar11 + uVar7;
        bVar13 = CARRY8(uVar5,uVar8);
        uVar4 = uVar5 + uVar8;
        uVar5 = uVar4 + bVar12;
      }
      uVar9 = uVar9 | ((uVar5 != 0 || lVar10 != 0) || uVar11 != 0);
    }
    fVar14 = roundAndPackFloat128
                       ((flag)local_58,zExp,uVar3 >> 0xf,uVar3 << 0x31 | uVar9 >> 0xf,uVar9 << 0x31,
                        local_78);
  }
  else {
    if (bExp != 0x7fff) goto LAB_008b15ee;
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_68 != 0) goto LAB_008b15b2;
LAB_008b182f:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar7 & 0x8000000000000000;
    fVar14 = (float128)(auVar2 << 0x40);
  }
  return fVar14;
}

Assistant:

float128 float128_div(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if (bSig0 | bSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return packFloat128( zSign, 0, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
            if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return float128_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    zExp = aExp - bExp + 0x3FFD;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000), aSig1, 15, &aSig0, &aSig1 );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    if ( le128( bSig0, bSig1, aSig0, aSig1 ) ) {
        shift128Right( aSig0, aSig1, 1, &aSig0, &aSig1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig0, aSig1, bSig0 );
    mul128By64To192( bSig0, bSig1, zSig0, &term0, &term1, &term2 );
    sub192( aSig0, aSig1, 0, term0, term1, term2, &rem0, &rem1, &rem2 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add192( rem0, rem1, rem2, 0, bSig0, bSig1, &rem0, &rem1, &rem2 );
    }
    zSig1 = estimateDiv128To64( rem1, rem2, bSig0 );
    if ( ( zSig1 & 0x3FFF ) <= 4 ) {
        mul128By64To192( bSig0, bSig1, zSig1, &term1, &term2, &term3 );
        sub192( rem1, rem2, 0, term1, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add192( rem1, rem2, rem3, 0, bSig0, bSig1, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shift128ExtraRightJamming( zSig0, zSig1, 0, 15, &zSig0, &zSig1, &zSig2 );
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}